

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanTag(Scanner *this)

{
  uint AtColumn;
  iterator pcVar1;
  bool bVar2;
  iterator pcVar3;
  IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>
  *pIVar4;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  local_a8;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  local_a0;
  undefined1 local_88 [8];
  Token T;
  uint ColStart;
  iterator Start;
  Scanner *this_local;
  
  pcVar1 = this->Current;
  AtColumn = this->Column;
  skip(this,1);
  if ((this->Current != this->End) && (bVar2 = isBlankOrBreak(this,this->Current), !bVar2)) {
    if (*this->Current == '<') {
      skip(this,1);
      scan_ns_uri_char(this);
      bVar2 = consume(this,0x3e);
      if (!bVar2) {
        return false;
      }
    }
    else {
      T.Value.field_2._8_8_ = skip_ns_char;
      pcVar3 = skip_while(this,0x28df80,(iterator)0x0);
      this->Current = pcVar3;
    }
  }
  Token::Token((Token *)local_88);
  local_88._0_4_ = TK_Tag;
  T.Range.Data = this->Current + -(long)pcVar1;
  T._0_8_ = pcVar1;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_88);
  local_a8.I.NodePtr =
       (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
        )AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
         ::end(&this->TokenQueue);
  pIVar4 = iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
           ::operator--(&local_a8);
  local_a0.I.NodePtr =
       (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
        )(pIVar4->
         super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
         ).I.NodePtr;
  saveSimpleKeyCandidate(this,(iterator)local_a0.I.NodePtr,AtColumn,false);
  this->IsSimpleKeyAllowed = false;
  Token::~Token((Token *)local_88);
  return true;
}

Assistant:

bool Scanner::scanTag() {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  skip(1); // Eat !.
  if (Current == End || isBlankOrBreak(Current)); // An empty tag.
  else if (*Current == '<') {
    skip(1);
    scan_ns_uri_char();
    if (!consume('>'))
      return false;
  } else {
    // FIXME: Actually parse the c-ns-shorthand-tag rule.
    Current = skip_while(&Scanner::skip_ns_char, Current);
  }

  Token T;
  T.Kind = Token::TK_Tag;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Tags can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}